

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

QAccessibleInterface * getOrCreateMenu(QWidget *menu,QAction *action)

{
  QAccessibleMenuItem *this;
  
  this = (QAccessibleMenuItem *)QAccessible::queryAccessibleInterface((QObject *)action);
  if (this == (QAccessibleMenuItem *)0x0) {
    this = (QAccessibleMenuItem *)operator_new(0x28);
    QAccessibleMenuItem::QAccessibleMenuItem(this,menu,action);
    QAccessible::registerAccessibleInterface((QAccessibleInterface *)this);
  }
  return &this->super_QAccessibleInterface;
}

Assistant:

QAccessibleInterface *getOrCreateMenu(QWidget *menu, QAction *action)
{
    QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(action);
    if (!iface) {
        iface = new QAccessibleMenuItem(menu, action);
        QAccessible::registerAccessibleInterface(iface);
    }
    return iface;
}